

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::adaptive_huffman_data_model::reset(adaptive_huffman_data_model *this)

{
  unsigned_short *puVar1;
  uint *in_RDI;
  uint i;
  adaptive_huffman_data_model *in_stack_00000030;
  uint local_c;
  
  if (*in_RDI != 0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      puVar1 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)(in_RDI + 4),local_c);
      *puVar1 = 1;
    }
    in_RDI[3] = 0;
    in_RDI[1] = *in_RDI;
    update(in_stack_00000030);
    in_RDI[1] = 8;
    in_RDI[2] = 8;
  }
  return;
}

Assistant:

void adaptive_huffman_data_model::reset() {
  if (!m_total_syms)
    return;

  for (uint i = 0; i < m_total_syms; i++)
    m_sym_freq[i] = 1;

  m_total_count = 0;
  m_update_cycle = m_total_syms;

  update();

  m_symbols_until_update = m_update_cycle = 8;  //(m_total_syms + 6) >> 1;
}